

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O0

_Bool target_set_interactive(wchar_t mode,wchar_t x,wchar_t y)

{
  ushort uVar1;
  wchar_t x1;
  wchar_t wy;
  wchar_t wx;
  unkuint9 Var2;
  chunk_conflict *pcVar3;
  player *ppVar4;
  byte bVar5;
  _Bool _Var6;
  _Bool _Var7;
  int16_t iVar8;
  int iVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  loc_conflict lVar12;
  monster *pmVar13;
  object *poVar14;
  loc_conflict grid2;
  mouseclick mVar15;
  command *pcVar16;
  loc lVar17;
  uint8_t uVar21;
  uint8_t uVar22;
  bool bVar18;
  bool bVar19;
  ui_event uVar20;
  ui_event e;
  ui_event e_00;
  ui_event e_01;
  ui_event e_02;
  ui_event e_03;
  ui_event e_04;
  ui_event e_05;
  ui_event e_06;
  ui_event e_07;
  ui_event e_08;
  ui_event e_09;
  ui_event e_10;
  ui_event e_11;
  ui_event e_12;
  ui_event e_13;
  ui_event e_14;
  ui_event e_15;
  ui_event e_16;
  ui_event e_17;
  ui_event e_18;
  ui_event e_19;
  ui_event e_20;
  ui_event e_21;
  keypress ch;
  keypress ch_00;
  wchar_t local_ba0;
  wchar_t local_b9c;
  wchar_t local_b98;
  wchar_t local_b94;
  wchar_t local_b90;
  wchar_t local_b8c;
  wchar_t local_b50;
  wchar_t local_b4c;
  int local_b48;
  wchar_t local_b44;
  wchar_t local_b40;
  wchar_t local_b3c;
  _Bool local_aea;
  wchar_t step;
  wchar_t old_wx;
  wchar_t old_wy;
  wchar_t new_index;
  wchar_t old_x;
  wchar_t old_y;
  wchar_t dir;
  loc local_a88;
  loc new_grid_2;
  loc local_a68;
  loc new_grid_1;
  loc local_a48;
  loc new_grid;
  monster *m_local_1;
  wchar_t local_9a0;
  wchar_t dist;
  wchar_t i;
  wchar_t min_dist;
  monster *m_local;
  byte bStack_884;
  byte bStack_883;
  ui_event press;
  _Bool has_object;
  wchar_t local_854;
  _Bool has_target;
  _Bool use_free_mode;
  _Bool use_interesting_mode;
  _Bool path_drawn;
  wchar_t target_index;
  point_set *targets;
  wchar_t *local_840;
  wchar_t *path_attr;
  wchar_t *path_char;
  byte local_827;
  _Bool local_826;
  byte local_825;
  keycode_t ignore_key;
  _Bool help;
  _Bool show_interesting;
  int iStack_820;
  _Bool done;
  wchar_t help_prompt_loc;
  wchar_t hgt;
  wchar_t wid;
  loc path_g [256];
  wchar_t path_n;
  wchar_t y_local;
  wchar_t x_local;
  wchar_t mode_local;
  undefined5 uVar23;
  undefined5 uVar24;
  
  local_825 = 0;
  local_826 = true;
  local_827 = 0;
  path_g[0xff].y = y;
  bVar5 = cmd_lookup_key(CMD_IGNORE,(uint)(((player->opts).opt[1] & 1U) != 0));
  path_char._4_4_ = (uint)bVar5;
  path_attr = (wchar_t *)mem_zalloc((ulong)z_info->max_range << 2);
  local_840 = (wchar_t *)mem_zalloc((ulong)z_info->max_range << 2);
  pcVar3 = cave;
  if ((x != L'\xffffffff') && (path_g[0xff].y != -1)) {
    targets = (point_set *)loc(x,path_g[0xff].y);
    _Var6 = square_in_bounds_fully((chunk *)pcVar3,(loc_conflict)targets);
    if (_Var6) {
      local_826 = false;
      path_n = x;
      goto LAB_00275f5e;
    }
  }
  path_n = (player->grid).x;
  path_g[0xff].y = (player->grid).y;
LAB_00275f5e:
  target_set_monster((monster *)0x0);
  disallow_animations();
  Term_get_size(&help_prompt_loc,&stack0xfffffffffffff7e0);
  ignore_key = iStack_820 + L'\xffffffff';
  prt("Press \'?\' for help.",ignore_key,L'\0');
  _has_target = target_get_monsters(mode,(monster_predicate)0x0,true);
  local_854 = L'\0';
  while (((local_825 ^ 0xff) & 1) != 0) {
    bVar19 = false;
    bVar18 = false;
    if ((local_826 & 1U) != 0) {
      iVar9 = point_set_size((point_set_conflict *)_has_target);
      bVar18 = iVar9 != 0;
    }
    _Var6 = (_Bool)(bVar18 ^ 1);
    if (bVar18) {
      path_g[0xff].y = _has_target->pts[local_854].y;
      path_n = _has_target->pts[local_854].x;
      adjust_panel_help(path_g[0xff].y,path_n,(_Bool)(local_827 & 1),player,mode,(point_set **)0x0,
                        (_Bool *)0x0,(wchar_t *)0x0);
    }
    pcVar3 = cave;
    if ((local_827 & 1) != 0) {
      lVar12 = (loc_conflict)loc(path_n,path_g[0xff].y);
      pmVar13 = square_monster((chunk *)pcVar3,lVar12);
      _Var7 = target_able(pmVar13);
      pcVar3 = cave;
      local_aea = false;
      if ((mode & 1U) == 0) {
        lVar12 = (loc_conflict)loc(path_n,path_g[0xff].y);
        poVar14 = square_object((chunk *)pcVar3,lVar12);
        local_aea = pile_has_known(poVar14);
      }
      target_display_help(_Var7,local_aea,_Var6);
    }
    pcVar3 = cave;
    uVar1 = z_info->max_range;
    lVar12 = (loc_conflict)loc((player->grid).x,(player->grid).y);
    grid2 = (loc_conflict)loc(path_n,path_g[0xff].y);
    path_g[0xff].x =
         project_path((chunk *)pcVar3,(loc_conflict *)&hgt,(uint)uVar1,lVar12,grid2,L'င');
    if ((mode & 1U) != 0) {
      wVar10 = draw_path((uint16_t)path_g[0xff].x,(loc *)&hgt,path_attr,local_840,(player->grid).y,
                         (player->grid).x);
      bVar19 = wVar10 != L'\0';
    }
    uVar20 = target_set_interactive_aux(path_g[0xff].y,path_n,mode | (uint)_Var6 * 2);
    mVar15 = uVar20.mouse;
    if (bVar19) {
      load_path((uint16_t)path_g[0xff].x,(loc *)&hgt,path_attr,local_840);
    }
    Var2 = uVar20._0_9_;
    e._9_3_ = 0;
    e._0_9_ = Var2;
    _Var7 = event_is_mouse_m(e,'\x02','\x01');
    bStack_883 = uVar20.key.code._1_1_;
    bStack_884 = (byte)uVar20.key.code;
    if ((_Var7) ||
       (uVar20._9_3_ = 0, uVar20._0_9_ = Var2, _Var7 = event_is_mouse(uVar20,'\x03'), _Var7)) {
      pcVar3 = cave;
      path_g[0xff].y =
           (int)((uint)bStack_883 - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
           Term->offset_y;
      path_n = (int)((uint)bStack_884 - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
               Term->offset_x;
      if (_Var6 == false) {
        lVar12 = (loc_conflict)loc(path_n,path_g[0xff].y);
        pmVar13 = square_monster((chunk *)pcVar3,lVar12);
        _Var6 = target_able(pmVar13);
        if (_Var6) {
          target_set_monster(pmVar13);
          local_825 = 1;
        }
        else {
          bell();
          pcVar3 = cave;
          lVar12 = (loc_conflict)loc(path_n,path_g[0xff].y);
          _Var6 = square_in_bounds((chunk *)pcVar3,lVar12);
          if (!_Var6) {
            path_n = (player->grid).x;
            path_g[0xff].y = (player->grid).y;
          }
        }
      }
      else {
        target_set_location(path_g[0xff].y,path_n);
        local_825 = 1;
      }
    }
    else {
      e_00._9_3_ = 0;
      e_00._0_9_ = Var2;
      _Var7 = event_is_mouse_m(e_00,'\x02','\x04');
      if (_Var7) {
        path_g[0xff].y =
             (int)((uint)bStack_883 - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
             Term->offset_y;
        path_n = (int)((uint)bStack_884 - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
                 Term->offset_x;
        cmdq_push(CMD_PATHFIND);
        pcVar16 = cmdq_peek();
        lVar12 = (loc_conflict)loc(path_n,path_g[0xff].y);
        cmd_set_arg_point(pcVar16,"point",lVar12);
        local_825 = 1;
      }
      else {
        e_01._9_3_ = 0;
        e_01._0_9_ = Var2;
        _Var7 = event_is_mouse(e_01,'\x02');
        if (_Var7) {
          if ((((_Var6 != false) && ((mode & 1U) != 0)) &&
              (path_g[0xff].y ==
               (int)((uint)bStack_883 - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
               Term->offset_y)) &&
             (path_n == (int)((uint)bStack_884 - col_map[Term->sidebar_mode]) /
                        (int)(uint)tile_width + Term->offset_x)) {
            target_set_location(path_g[0xff].y,path_n);
          }
          local_825 = 1;
        }
        else {
          e_02._9_3_ = 0;
          e_02._0_9_ = Var2;
          _Var7 = event_is_mouse(e_02,'\x01');
          if (_Var7) {
            path_g[0xff].y =
                 (int)((uint)bStack_883 - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height
                 + Term->offset_y;
            path_n = (int)((uint)bStack_884 - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
                     Term->offset_x;
            if (bStack_883 < 2) {
              path_g[0xff].y = path_g[0xff].y + -1;
            }
            else if ((int)(uint)bStack_883 < Term->hgt + -2) {
              if (col_map[Term->sidebar_mode] < (int)(uint)bStack_884) {
                if (Term->wid + -2 <= (int)(uint)bStack_884) {
                  path_n = path_n + L'\x01';
                }
              }
              else {
                path_n = path_n + L'\xffffffff';
              }
            }
            else {
              path_g[0xff].y = path_g[0xff].y + 1;
            }
            if (cave->width + L'\xffffffff' < path_n) {
              local_b3c = cave->width + L'\xffffffff';
            }
            else {
              local_b3c = path_n;
            }
            if (local_b3c < L'\x01') {
              local_b44 = L'\0';
            }
            else {
              if (cave->width + L'\xffffffff' < path_n) {
                local_b40 = cave->width + L'\xffffffff';
              }
              else {
                local_b40 = path_n;
              }
              local_b44 = local_b40;
            }
            path_n = local_b44;
            if (cave->height + -1 < path_g[0xff].y) {
              local_b48 = cave->height + -1;
            }
            else {
              local_b48 = path_g[0xff].y;
            }
            if (local_b48 < 1) {
              local_b50 = L'\0';
            }
            else {
              if (cave->height + -1 < path_g[0xff].y) {
                local_b4c = cave->height + L'\xffffffff';
              }
              else {
                local_b4c = path_g[0xff].y;
              }
              local_b50 = local_b4c;
            }
            path_g[0xff].y = local_b50;
            adjust_panel_help(local_b50,local_b44,(_Bool)(local_827 & 1),player,mode,
                              (point_set **)&has_target,&local_826,&local_854);
          }
          else {
            e_03._9_3_ = 0;
            e_03._0_9_ = Var2;
            _Var7 = event_is_key(e_03,0xe000);
            if ((_Var7) ||
               (e_04._9_3_ = 0, e_04._0_9_ = Var2, _Var7 = event_is_key(e_04,0x71), _Var7)) {
              local_825 = 1;
            }
            else {
              e_05._9_3_ = 0;
              e_05._0_9_ = Var2;
              _Var7 = event_is_key(e_05,0x20);
              if (((_Var7) ||
                  (e_06._9_3_ = 0, e_06._0_9_ = Var2, _Var7 = event_is_key(e_06,0x2a), _Var7)) ||
                 (e_07._9_3_ = 0, e_07._0_9_ = Var2, _Var7 = event_is_key(e_07,0x2b), _Var7)) {
                if (bVar18 != false) {
                  wVar10 = local_854 + L'\x01';
                  local_854 = wVar10;
                  wVar11 = point_set_size((point_set_conflict *)_has_target);
                  if (wVar10 == wVar11) {
                    local_854 = L'\0';
                  }
                }
              }
              else {
                e_08._9_3_ = 0;
                e_08._0_9_ = Var2;
                _Var7 = event_is_key(e_08,0x2d);
                if (_Var7) {
                  if ((bVar18 != false) &&
                     (wVar10 = local_854 + L'\xffffffff', bVar18 = local_854 == L'\0',
                     local_854 = wVar10, bVar18)) {
                    iVar9 = point_set_size((point_set_conflict *)_has_target);
                    local_854 = iVar9 + L'\xffffffff';
                  }
                }
                else {
                  e_09._9_3_ = 0;
                  e_09._0_9_ = Var2;
                  _Var7 = event_is_key(e_09,0x70);
                  if (_Var7) {
                    path_g[0xff].y = (player->grid).y;
                    path_n = (player->grid).x;
                    local_826 = false;
                    verify_panel();
                    handle_stuff(player);
                  }
                  else {
                    e_10._9_3_ = 0;
                    e_10._0_9_ = Var2;
                    _Var7 = event_is_key(e_10,0x6f);
                    if (_Var7) {
                      local_826 = false;
                    }
                    else {
                      e_11._9_3_ = 0;
                      e_11._0_9_ = Var2;
                      _Var7 = event_is_key(e_11,0x6d);
                      if (_Var7) {
                        if ((_Var6 != false) &&
                           (iVar9 = point_set_size((point_set_conflict *)_has_target), 0 < iVar9)) {
                          local_826 = true;
                          local_854 = L'\0';
                          dist = L'ϧ';
                          for (local_9a0 = L'\0';
                              wVar10 = point_set_size((point_set_conflict *)_has_target),
                              local_9a0 < wVar10; local_9a0 = local_9a0 + L'\x01') {
                            lVar17 = loc(path_n,path_g[0xff].y);
                            wVar10 = distance(lVar17,_has_target->pts[local_9a0]);
                            if (wVar10 < dist) {
                              local_854 = local_9a0;
                              dist = wVar10;
                            }
                          }
                        }
                      }
                      else {
                        e_12._9_3_ = 0;
                        e_12._0_9_ = Var2;
                        _Var6 = event_is_key(e_12,0x74);
                        if ((((_Var6) ||
                             (e_13._9_3_ = 0, e_13._0_9_ = Var2, _Var6 = event_is_key(e_13,0x35),
                             _Var6)) ||
                            (e_14._9_3_ = 0, e_14._0_9_ = Var2, _Var6 = event_is_key(e_14,0x30),
                            _Var6)) ||
                           (e_15._9_3_ = 0, e_15._0_9_ = Var2, _Var6 = event_is_key(e_15,0x2e),
                           _Var6)) {
                          pcVar3 = cave;
                          if (bVar18 == false) {
                            target_set_location(path_g[0xff].y,path_n);
                            local_825 = 1;
                          }
                          else {
                            lVar12 = (loc_conflict)loc(path_n,path_g[0xff].y);
                            pmVar13 = square_monster((chunk *)pcVar3,lVar12);
                            _Var6 = target_able(pmVar13);
                            if (_Var6) {
                              target_set_monster(pmVar13);
                              local_825 = 1;
                            }
                            else {
                              bell();
                            }
                          }
                        }
                        else {
                          e_16._9_3_ = 0;
                          e_16._0_9_ = Var2;
                          _Var6 = event_is_key(e_16,0x67);
                          if (_Var6) {
                            cmdq_push(CMD_PATHFIND);
                            pcVar16 = cmdq_peek();
                            lVar12 = (loc_conflict)loc(path_n,path_g[0xff].y);
                            cmd_set_arg_point(pcVar16,"point",lVar12);
                            local_825 = 1;
                          }
                          else {
                            e_17._9_3_ = 0;
                            e_17._0_9_ = Var2;
                            _Var6 = event_is_key(e_17,path_char._4_4_);
                            pcVar3 = cave;
                            if (_Var6) {
                              if ((mode & 1U) == 0) {
                                lVar12 = (loc_conflict)loc(path_n,path_g[0xff].y);
                                poVar14 = square_object((chunk *)pcVar3,lVar12);
                                _Var6 = pile_is_tracked(poVar14);
                                if (_Var6) {
                                  textui_cmd_ignore_menu(player->upkeep->object);
                                  handle_stuff(player);
                                  point_set_dispose((point_set_conflict *)_has_target);
                                  _has_target = target_get_monsters(mode,(monster_predicate)0x0,true
                                                                   );
                                }
                              }
                            }
                            else {
                              e_18._9_3_ = 0;
                              e_18._0_9_ = Var2;
                              new_grid = (loc)mVar15;
                              _Var6 = event_is_key(e_18,0x3e);
                              ppVar4 = player;
                              if (_Var6) {
                                lVar17 = loc(path_n,path_g[0xff].y);
                                wVar10 = path_nearest_known(ppVar4,lVar17,square_isdownstairs,
                                                            &local_a48,(int16_t **)0x0);
                                if (wVar10 < L'\x01') {
                                  bell();
                                }
                                else {
                                  path_n = local_a48.x;
                                  path_g[0xff].y = local_a48.y;
                                  adjust_panel_help(local_a48.y,local_a48.x,(_Bool)(local_827 & 1),
                                                    player,mode,(point_set **)&has_target,&local_826
                                                    ,&local_854);
                                }
                              }
                              else {
                                e_19._9_3_ = 0;
                                e_19._0_9_ = Var2;
                                new_grid_1 = (loc)mVar15;
                                _Var6 = event_is_key(e_19,0x3c);
                                ppVar4 = player;
                                if (_Var6) {
                                  lVar17 = loc(path_n,path_g[0xff].y);
                                  wVar10 = path_nearest_known(ppVar4,lVar17,square_isupstairs,
                                                              &local_a68,(int16_t **)0x0);
                                  if (wVar10 < L'\x01') {
                                    bell();
                                  }
                                  else {
                                    path_n = local_a68.x;
                                    path_g[0xff].y = local_a68.y;
                                    adjust_panel_help(local_a68.y,local_a68.x,(_Bool)(local_827 & 1)
                                                      ,player,mode,(point_set **)&has_target,
                                                      &local_826,&local_854);
                                  }
                                }
                                else {
                                  e_20._9_3_ = 0;
                                  e_20._0_9_ = Var2;
                                  new_grid_2 = (loc)mVar15;
                                  _Var6 = event_is_key(e_20,0x78);
                                  ppVar4 = player;
                                  if (_Var6) {
                                    lVar17 = loc(path_n,path_g[0xff].y);
                                    wVar10 = path_nearest_unknown
                                                       (ppVar4,lVar17,&local_a88,(int16_t **)0x0);
                                    if (wVar10 < L'\x01') {
                                      bell();
                                    }
                                    else {
                                      path_n = local_a88.x;
                                      path_g[0xff].y = local_a88.y;
                                      adjust_panel_help(local_a88.y,local_a88.x,
                                                        (_Bool)(local_827 & 1),player,mode,
                                                        (point_set **)&has_target,&local_826,
                                                        &local_854);
                                    }
                                  }
                                  else {
                                    e_21._9_3_ = 0;
                                    e_21._0_9_ = Var2;
                                    _Var6 = event_is_key(e_21,0x3f);
                                    if (_Var6) {
                                      local_827 = (local_827 ^ 0xff) & 1;
                                      player->upkeep->redraw = player->upkeep->redraw | 0x5bfff;
                                      Term_clear();
                                      handle_stuff(player);
                                      if ((local_827 & 1) == 0) {
                                        prt("Press \'?\' for help.",ignore_key,L'\0');
                                      }
                                    }
                                    else {
                                      ch._9_3_ = 0;
                                      ch.type = (int)Var2;
                                      register0x0000003c = (int)(Var2 >> 0x20);
                                      register0x00000030 = (char)(Var2 >> 0x40);
                                      wVar10 = target_dir(ch);
                                      if (wVar10 == L'\0') {
                                        bell();
                                      }
                                      else if (bVar18 == false) {
                                        ch_00._9_3_ = 0;
                                        ch_00.type = (int)Var2;
                                        register0x0000003c = (int)(Var2 >> 0x20);
                                        register0x00000030 = (char)(Var2 >> 0x40);
                                        _Var6 = is_running_keymap(ch_00);
                                        iVar9 = 1;
                                        if (_Var6) {
                                          iVar9 = 10;
                                        }
                                        local_b90 = iVar9 * ddx[wVar10] + path_n;
                                        local_b9c = iVar9 * ddy[wVar10] + path_g[0xff].y;
                                        local_b8c = local_b90;
                                        if (cave->width + L'\xfffffffe' < local_b90) {
                                          local_b8c = cave->width + L'\xfffffffe';
                                        }
                                        if (local_b8c < L'\x02') {
                                          local_b94 = L'\x01';
                                        }
                                        else {
                                          if (cave->width + L'\xfffffffe' < local_b90) {
                                            local_b90 = cave->width + L'\xfffffffe';
                                          }
                                          local_b94 = local_b90;
                                        }
                                        path_n = local_b94;
                                        local_b98 = local_b9c;
                                        if (cave->height + L'\xfffffffe' < local_b9c) {
                                          local_b98 = cave->height + L'\xfffffffe';
                                        }
                                        if (local_b98 < L'\x02') {
                                          local_ba0 = L'\x01';
                                        }
                                        else {
                                          if (cave->height + L'\xfffffffe' < local_b9c) {
                                            local_b9c = cave->height + L'\xfffffffe';
                                          }
                                          local_ba0 = local_b9c;
                                        }
                                        path_g[0xff].y = local_ba0;
                                        adjust_panel_help(local_ba0,local_b94,(_Bool)(local_827 & 1)
                                                          ,player,mode,(point_set **)&has_target,
                                                          (_Bool *)0x0,(wchar_t *)0x0);
                                      }
                                      else {
                                        wVar11 = _has_target->pts[local_854].y;
                                        x1 = _has_target->pts[local_854].x;
                                        iVar8 = target_pick(wVar11,x1,(int)ddy[wVar10],
                                                            (int)ddx[wVar10],_has_target);
                                        old_wx = (wchar_t)iVar8;
                                        if (old_wx < L'\0') {
                                          wy = Term->offset_y;
                                          wx = Term->offset_x;
                                          _Var6 = change_panel(wVar10);
                                          if (_Var6) {
                                            point_set_dispose((point_set_conflict *)_has_target);
                                            _has_target = target_get_monsters(mode,(
                                                  monster_predicate)0x0,true);
                                            iVar8 = target_pick(wVar11,x1,(int)ddy[wVar10],
                                                                (int)ddx[wVar10],_has_target);
                                            old_wx = (wchar_t)iVar8;
                                            if ((old_wx < L'\0') &&
                                               (_Var6 = modify_panel((term_conflict2 *)Term,wy,wx),
                                               _Var6)) {
                                              point_set_dispose((point_set_conflict *)_has_target);
                                              _has_target = target_get_monsters(mode,(
                                                  monster_predicate)0x0,true);
                                            }
                                            handle_stuff(player);
                                          }
                                        }
                                        if (L'\xffffffff' < old_wx) {
                                          local_854 = old_wx;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  point_set_dispose((point_set_conflict *)_has_target);
  if ((local_827 & 1) == 0) {
    prt("",L'\0',L'\0');
    prt("",ignore_key,L'\0');
    player->upkeep->redraw = player->upkeep->redraw | 0x3000;
  }
  else {
    player->upkeep->redraw = player->upkeep->redraw | 0x5bfff;
    Term_clear();
  }
  verify_panel();
  handle_stuff(player);
  mem_free(local_840);
  mem_free(path_attr);
  allow_animations();
  _Var6 = target_is_set();
  return _Var6;
}

Assistant:

bool target_set_interactive(int mode, int x, int y)
{
	int path_n;
	struct loc path_g[256];

	int wid, hgt, help_prompt_loc;

	bool done = false;
	bool show_interesting = true;
	bool help = false;
	keycode_t ignore_key = cmd_lookup_key(CMD_IGNORE,
		(OPT(player, rogue_like_commands)) ?
		KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG);

	/* These are used for displaying the path to the target */
	wchar_t *path_char = mem_zalloc(z_info->max_range * sizeof(wchar_t));
	int *path_attr = mem_zalloc(z_info->max_range * sizeof(int));

	/* If we haven't been given an initial location, start on the
	   player, otherwise  honour it by going into "free targetting" mode. */
	if (x == -1 || y == -1 || !square_in_bounds_fully(cave, loc(x, y))) {
		x = player->grid.x;
		y = player->grid.y;
	} else {
		show_interesting = false;
	}

	/* Cancel target */
	target_set_monster(0);

	/* Prevent animations */
	disallow_animations();

	/* Calculate the window location for the help prompt */
	Term_get_size(&wid, &hgt);
	help_prompt_loc = hgt - 1;
	
	/* Display the help prompt */
	prt("Press '?' for help.", help_prompt_loc, 0);

	/* Prepare the target set */
	struct point_set *targets = target_get_monsters(mode, NULL, true);
	int target_index = 0;

	/* Interact */
	while (!done) {
		bool path_drawn = false;
		bool use_interesting_mode = show_interesting && point_set_size(targets);
		bool use_free_mode = !use_interesting_mode;

		/* Use an interesting grid if requested and there are any */
		if (use_interesting_mode) {
			y = targets->pts[target_index].y;
			x = targets->pts[target_index].x;

			/* Adjust panel if needed */
			adjust_panel_help(y, x, help, player, mode, NULL,
				NULL, NULL);
		}

		/* Update help */
		if (help) {
			bool has_target = target_able(square_monster(cave, loc(x, y)));
			bool has_object = !(mode & TARGET_KILL)
					&& pile_has_known(square_object(cave, loc(x, y)));
			target_display_help(has_target, has_object, use_free_mode);
		}

		/* Find the path. */
		path_n = project_path(cave, path_g, z_info->max_range,
							  loc(player->grid.x, player->grid.y), loc(x, y),
							  PROJECT_THRU | PROJECT_INFO);

		/* Draw the path in "target" mode. If there is one */
		if (mode & (TARGET_KILL))
			path_drawn = draw_path(path_n, path_g, path_char, path_attr,
					player->grid.y, player->grid.x);

		/* Describe and Prompt */
		ui_event press = target_set_interactive_aux(y, x,
				mode | (use_free_mode ? TARGET_LOOK : 0));

		/* Remove the path */
		if (path_drawn) load_path(path_n, path_g, path_char, path_attr);

		/* Handle an input event */
		if (event_is_mouse_m(press, 2, KC_MOD_CONTROL) || event_is_mouse(press, 3)) {
			/* Set a target and done */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);
			if (use_free_mode) {
				/* Free mode: Target a location */
				target_set_location(y, x);
				done = true;
			} else {
				/* Interesting mode: Try to target a monster and done, or bell */
				struct monster *m_local = square_monster(cave, loc(x, y));

				if (target_able(m_local)) {
					/* Monster race and health tracked by target_set_interactive_aux() */
					target_set_monster(m_local);
					done = true;
				} else {
					bell();
					if (!square_in_bounds(cave, loc(x, y))) {
						x = player->grid.x;
						y = player->grid.y;
					}
				}
			}

		} else if (event_is_mouse_m(press, 2, KC_MOD_ALT)) {
			/* Navigate to location and done */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);
			cmdq_push(CMD_PATHFIND);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			done = true;

		} else if (event_is_mouse(press, 2)) {
			/* Cancel and done */
			if (use_free_mode && (mode & TARGET_KILL)
					&& y == KEY_GRID_Y(press) && x == KEY_GRID_X(press)) {
				/* Free/kill mode: Clicked current location, set target */
				target_set_location(y, x);
			}
			done = true;

		} else if (event_is_mouse(press, 1)) {
			/* Relocate cursor */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);

			/* If they clicked on an edge of the map, drag the cursor further
			   to trigger a panel scroll */
			if (press.mouse.y <= 1) {
				y--;
			} else if (press.mouse.y >= Term->hgt - 2) {
				y++;
			} else if (press.mouse.x <= COL_MAP) {
				x--;
			} else if (press.mouse.x >= Term->wid - 2) {
				x++;
			}

			/* Restrict cursor to inbounds */
			x = MAX(0, MIN(x, cave->width - 1));
			y = MAX(0, MIN(y, cave->height - 1));

			/*
			 * Adjust panel and target list if needed; also
			 * adjust interesting mode
			 */
			adjust_panel_help(y, x, help, player, mode, &targets,
				&show_interesting, &target_index);

		} else if (event_is_key(press, ESCAPE) || event_is_key(press, 'q')) {
			/* Cancel */
			done = true;

		} else if (event_is_key(press, ' ') || event_is_key(press, '*')
				|| event_is_key(press, '+')) {
			/* Cycle interesting target forward */
			if (use_interesting_mode && ++target_index == point_set_size(targets)) {
				target_index = 0;
			}

		} else if (event_is_key(press, '-')) {
			/* Cycle interesting target backwards */
			if (use_interesting_mode && target_index-- == 0) {
				target_index = point_set_size(targets) - 1;
			}

		} else if (event_is_key(press, 'p')) {
			/* Focus the player and switch to free mode */
			y = player->grid.y;
			x = player->grid.x;
			show_interesting = false;

			/* Recenter around player */
			verify_panel();
			handle_stuff(player);

		} else if (event_is_key(press, 'o')) {
			/* Switch to free mode */
			show_interesting = false;

		} else if (event_is_key(press, 'm')) {
			/* Switch to interesting mode */
			if (use_free_mode && point_set_size(targets) > 0) {
				show_interesting = true;
				target_index = 0;
				int min_dist = 999;

				/* Pick the nearest interesting target */
				for (int i = 0; i < point_set_size(targets); i++) {
					int dist = distance(loc(x, y), targets->pts[i]);
					if (dist < min_dist) {
						target_index = i;
						min_dist = dist;
					}
				}
			}

		} else if (event_is_key(press, 't') || event_is_key(press, '5')
				|| event_is_key(press, '0') || event_is_key(press, '.')) {
			/* Set a target and done */
			if (use_interesting_mode) {
				struct monster *m_local = square_monster(cave, loc(x, y));

				if (target_able(m_local)) {
					/* Monster race and health tracked by target_set_interactive_aux() */
					target_set_monster(m_local);
					done = true;
				} else {
					bell();
				}
			} else {
				target_set_location(y, x);
				done = true;
			}

		} else if (event_is_key(press, 'g')) {
			/* Navigate to a location and done */
			cmdq_push(CMD_PATHFIND);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			done = true;

		} else if (event_is_key(press, ignore_key)) {
			/* Ignore the tracked object, set by target_set_interactive_aux() */
			if (!(mode & TARGET_KILL)
					&& pile_is_tracked(square_object(cave, loc(x, y)))) {
				textui_cmd_ignore_menu(player->upkeep->object);
				handle_stuff(player);

				/* Recalculate interesting grids */
				point_set_dispose(targets);
				targets = target_get_monsters(mode, NULL, true);
			}

		} else if (event_is_key(press, '>')) {
			struct loc new_grid;

			if (path_nearest_known(player, loc(x, y),
					square_isdownstairs, &new_grid, NULL)
					> 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, '<')) {
			struct loc new_grid;

			if (path_nearest_known(player, loc(x, y),
					square_isupstairs, &new_grid, NULL)
					> 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, 'x')) {
			struct loc new_grid;

			if (path_nearest_unknown(player, loc(x, y), &new_grid,
					NULL) > 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, '?')) {
			/* Toggle help text */
			help = !help;

			/* Redraw main window */
			player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP);
			Term_clear();
			handle_stuff(player);
			if (!help)
				prt("Press '?' for help.", help_prompt_loc, 0);

		} else {
			/* Try to extract a direction from the key press */
			int dir = target_dir(press.key);

			if (!dir) {
				bell();
			} else if (use_interesting_mode) {
				/* Interesting mode direction: Pick new interesting grid */
				int old_y = targets->pts[target_index].y;
				int old_x = targets->pts[target_index].x;
				int new_index;

				/* Look for a new interesting grid */
				new_index = target_pick(old_y, old_x, ddy[dir], ddx[dir], targets);

				/* If none found, try in the next panel */
				if (new_index < 0) {
					int old_wy = Term->offset_y;
					int old_wx = Term->offset_x;

					if (change_panel(dir)) {
						/* Recalculate interesting grids */
						point_set_dispose(targets);
						targets = target_get_monsters(mode, NULL, true);

						/* Look for a new interesting grid again */
						new_index = target_pick(old_y, old_x, ddy[dir], ddx[dir], targets);

						/* If none found again, reset the panel and do nothing */
						if (new_index < 0 && modify_panel(Term, old_wy, old_wx)) {
							/* Recalculate interesting grids */
							point_set_dispose(targets);
							targets = target_get_monsters(mode, NULL, true);
						}

						handle_stuff(player);
					}
				}

				/* Use interesting grid if found */
				if (new_index >= 0) target_index = new_index;
			} else {
				int step = (is_running_keymap(press.key)) ?
					10 : 1;

				/* Free mode direction: Move cursor */
				x += step * ddx[dir];
				y += step * ddy[dir];

				/* Keep 1 away from the edge */
				x = MAX(1, MIN(x, cave->width - 2));
				y = MAX(1, MIN(y, cave->height - 2));

				/* Adjust panel and target list if needed */
				adjust_panel_help(y, x, help, player, mode,
					&targets, NULL, NULL);
			}
		}
		/* End of while finally */
	}

	/* Forget */
	point_set_dispose(targets);

	/* Redraw as necessary */
	if (help) {
		player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP);
		Term_clear();
	} else {
		prt("", 0, 0);
		prt("", help_prompt_loc, 0);
		player->upkeep->redraw |= (PR_DEPTH | PR_STATUS);
	}

	/* Recenter around player */
	verify_panel();

	handle_stuff(player);

	mem_free(path_attr);
	mem_free(path_char);

	/* Allow animations again */
	allow_animations();

	return target_is_set();
}